

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O0

void __thiscall rcdiscover::WOL::sendImpl(WOL *this,array<unsigned_char,_4UL> *password)

{
  bool bVar1;
  reference this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  NetworkUnreachableException *anon_var_0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sendbuf;
  SocketLinux *socket;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> sockets;
  uint16_t in_stack_0000014e;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  in_stack_ffffffffffffffa0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  WOL *in_stack_ffffffffffffffb0;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [40];
  
  SocketLinux::createAndBindForAllInterfaces(in_stack_0000014e);
  local_30 = local_28;
  local_38._M_current =
       (SocketLinux *)
       std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::begin
                 (in_stack_ffffffffffffff68);
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::end
            (in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff70,
                            (__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffff70 =
         (__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
          *)&stack0xffffffffffffffa0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x128f90);
    appendMagicPacket(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      (array<unsigned_char,_4UL> *)in_stack_ffffffffffffffa0._M_current);
    Socket<rcdiscover::SocketLinux>::enableBroadcast((Socket<rcdiscover::SocketLinux> *)0x128fb3);
    Socket<rcdiscover::SocketLinux>::enableNonBlocking((Socket<rcdiscover::SocketLinux> *)0x128fbf);
    Socket<rcdiscover::SocketLinux>::send
              (&this_00->super_Socket<rcdiscover::SocketLinux>,(int)&stack0xffffffffffffffa0,__buf,
               in_RCX,in_R8D);
    in_stack_ffffffffffffff84 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (ulong)in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator++(&local_38);
  }
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::~vector
            ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void WOL::sendImpl(const std::array<uint8_t, 4> *password) const
{
  auto sockets = SocketType::createAndBindForAllInterfaces(port_);

  for (auto &socket : sockets)
  {
    std::vector<uint8_t> sendbuf;
    appendMagicPacket(sendbuf, password);

    socket.enableBroadcast();
    socket.enableNonBlocking();

    try
    {
      socket.send(sendbuf);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}